

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  Primitive *prim;
  uint uVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  ulong *puVar25;
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  vint4 ai_1;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  Precalculations pre;
  vint8 bi_1;
  vbool<8> valid0;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1369;
  RayK<8> *local_1368;
  AccelData *local_1360;
  ulong local_1358;
  RayK<8> *local_1350;
  RayQueryContext *local_1348;
  Primitive *local_1340;
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_12e0;
  uint local_12b0;
  uint uStack_12ac;
  uint uStack_12a8;
  uint uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 local_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  uint local_11e0;
  uint uStack_11dc;
  uint uStack_11d8;
  uint uStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_10a0;
  undefined4 local_1080;
  undefined4 uStack_107c;
  undefined4 uStack_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 uStack_1068;
  undefined4 uStack_1064;
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0 [494];
  
  auVar50 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
  auVar51 = ZEXT3264(auVar50);
  auVar7 = vpcmpeqd_avx2(auVar50,(undefined1  [32])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar7);
  if (uVar16 == 0) {
    return;
  }
  local_10a0.v = valid_i->field_0;
  local_1360 = This->ptr;
  local_1358 = (ulong)(uVar16 & 0xff);
  uStack_10e4 = *(undefined4 *)(ray + 0x1c);
  uStack_1104 = *(undefined4 *)(ray + 0x3c);
  auVar3 = *(undefined1 (*) [32])(ray + 0x80);
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  auVar42._16_4_ = 0x7fffffff;
  auVar42._20_4_ = 0x7fffffff;
  auVar42._24_4_ = 0x7fffffff;
  auVar42._28_4_ = 0x7fffffff;
  auVar46._8_4_ = 0x219392ef;
  auVar46._0_8_ = 0x219392ef219392ef;
  auVar46._12_4_ = 0x219392ef;
  auVar46._16_4_ = 0x219392ef;
  auVar46._20_4_ = 0x219392ef;
  auVar46._24_4_ = 0x219392ef;
  auVar46._28_4_ = 0x219392ef;
  auVar31 = vandps_avx(auVar3,auVar42);
  auVar31 = vcmpps_avx(auVar31,auVar46,1);
  auVar37 = vblendvps_avx(auVar3,auVar46,auVar31);
  uStack_1124 = *(undefined4 *)(ray + 0x5c);
  auVar31 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar38 = vandps_avx(auVar31,auVar42);
  auVar38 = vcmpps_avx(auVar38,auVar46,1);
  auVar44 = vblendvps_avx(auVar31,auVar46,auVar38);
  auVar38 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar33 = vandps_avx(auVar38,auVar42);
  auVar33 = vcmpps_avx(auVar33,auVar46,1);
  auVar42 = vrcpps_avx(auVar37);
  auVar33 = vblendvps_avx(auVar38,auVar46,auVar33);
  auVar43._8_4_ = 0x3f800000;
  auVar43._0_8_ = 0x3f8000003f800000;
  auVar43._12_4_ = 0x3f800000;
  auVar43._16_4_ = 0x3f800000;
  auVar43._20_4_ = 0x3f800000;
  auVar43._24_4_ = 0x3f800000;
  auVar43._28_4_ = 0x3f800000;
  auVar46 = vrcpps_avx(auVar44);
  auVar9 = vfnmadd213ps_fma(auVar37,auVar42,auVar43);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar42,auVar42);
  auVar52 = ZEXT1664(auVar9);
  auVar10 = vfnmadd213ps_fma(auVar44,auVar46,auVar43);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar46,auVar46);
  auVar53 = ZEXT1664(auVar10);
  auVar37 = vrcpps_avx(auVar33);
  auVar11 = vfnmadd213ps_fma(auVar33,auVar37,auVar43);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar37,auVar37);
  auVar54 = ZEXT1664(auVar11);
  auVar33 = ZEXT1232(ZEXT812(0)) << 0x20;
  local_11c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar33);
  local_1368 = ray + 0x100;
  local_1060 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar33);
  auVar55 = ZEXT3264(auVar50 ^ auVar7);
  auVar44 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar3 = vcmpps_avx(auVar3,auVar44,1);
  auVar33._8_4_ = 1;
  auVar33._0_8_ = 0x100000001;
  auVar33._12_4_ = 1;
  auVar33._16_4_ = 1;
  auVar33._20_4_ = 1;
  auVar33._24_4_ = 1;
  auVar33._28_4_ = 1;
  auVar3 = vandps_avx(auVar3,auVar33);
  auVar31 = vcmpps_avx(auVar31,auVar44,1);
  auVar37._8_4_ = 2;
  auVar37._0_8_ = 0x200000002;
  auVar37._12_4_ = 2;
  auVar37._16_4_ = 2;
  auVar37._20_4_ = 2;
  auVar37._24_4_ = 2;
  auVar37._28_4_ = 2;
  auVar31 = vandps_avx(auVar31,auVar37);
  auVar31 = vorps_avx(auVar31,auVar3);
  auVar3 = vcmpps_avx(auVar38,auVar44,1);
  auVar38._8_4_ = 4;
  auVar38._0_8_ = 0x400000004;
  auVar38._12_4_ = 4;
  auVar38._16_4_ = 4;
  auVar38._20_4_ = 4;
  auVar38._24_4_ = 4;
  auVar38._28_4_ = 4;
  auVar3 = vandps_avx(auVar3,auVar38);
  auVar50 = vpor_avx2(auVar50 ^ auVar7,auVar3);
  local_10c0 = vpor_avx2(auVar50,auVar31);
  local_1000 = *(float *)ray;
  fStack_ffc = *(float *)(ray + 4);
  fStack_ff8 = *(float *)(ray + 8);
  fStack_ff4 = *(float *)(ray + 0xc);
  fStack_ff0 = *(float *)(ray + 0x10);
  fStack_fec = *(float *)(ray + 0x14);
  fStack_fe8 = *(float *)(ray + 0x18);
  uStack_fe4 = uStack_10e4;
  local_1100 = auVar9._0_4_ * -*(float *)ray;
  fStack_10fc = auVar9._4_4_ * -*(float *)(ray + 4);
  fStack_10f8 = auVar9._8_4_ * -*(float *)(ray + 8);
  fStack_10f4 = auVar9._12_4_ * -*(float *)(ray + 0xc);
  fStack_10f0 = -*(float *)(ray + 0x10) * 0.0;
  fStack_10ec = -*(float *)(ray + 0x14) * 0.0;
  fStack_10e8 = -*(float *)(ray + 0x18) * 0.0;
  local_1020 = *(float *)(ray + 0x20);
  fStack_101c = *(float *)(ray + 0x24);
  fStack_1018 = *(float *)(ray + 0x28);
  fStack_1014 = *(float *)(ray + 0x2c);
  fStack_1010 = *(float *)(ray + 0x30);
  fStack_100c = *(float *)(ray + 0x34);
  fStack_1008 = *(float *)(ray + 0x38);
  uStack_1004 = uStack_1104;
  local_1120 = auVar10._0_4_ * -*(float *)(ray + 0x20);
  fStack_111c = auVar10._4_4_ * -*(float *)(ray + 0x24);
  fStack_1118 = auVar10._8_4_ * -*(float *)(ray + 0x28);
  fStack_1114 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1110 = -*(float *)(ray + 0x30) * 0.0;
  fStack_110c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1108 = -*(float *)(ray + 0x38) * 0.0;
  local_1040 = *(float *)(ray + 0x40);
  fStack_103c = *(float *)(ray + 0x44);
  fStack_1038 = *(float *)(ray + 0x48);
  fStack_1034 = *(float *)(ray + 0x4c);
  fStack_1030 = *(float *)(ray + 0x50);
  fStack_102c = *(float *)(ray + 0x54);
  fStack_1028 = *(float *)(ray + 0x58);
  uStack_1024 = uStack_1124;
  local_1140 = auVar11._0_4_ * -*(float *)(ray + 0x40);
  fStack_113c = auVar11._4_4_ * -*(float *)(ray + 0x44);
  fStack_1138 = auVar11._8_4_ * -*(float *)(ray + 0x48);
  fStack_1134 = auVar11._12_4_ * -*(float *)(ray + 0x4c);
  fStack_1130 = -*(float *)(ray + 0x50) * 0.0;
  fStack_112c = -*(float *)(ray + 0x54) * 0.0;
  fStack_1128 = -*(float *)(ray + 0x58) * 0.0;
  local_12b0 = 0x80000000;
  uStack_12ac = 0x80000000;
  uStack_12a8 = 0x80000000;
  uStack_12a4 = 0x80000000;
  local_1080 = 0x7f800000;
  uStack_107c = 0x7f800000;
  uStack_1078 = 0x7f800000;
  uStack_1074 = 0x7f800000;
  uStack_1070 = 0x7f800000;
  uStack_106c = 0x7f800000;
  uStack_1068 = 0x7f800000;
  uStack_1064 = 0x7f800000;
  local_1160 = ZEXT1632(auVar9);
  local_1180 = ZEXT1632(auVar10);
  local_11a0 = ZEXT1632(auVar11);
  local_1350 = ray;
  local_1348 = context;
LAB_0161e495:
  lVar8 = 0;
  for (uVar19 = local_1358; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    lVar8 = lVar8 + 1;
  }
  uVar17 = *(undefined4 *)(local_10c0 + lVar8 * 4);
  auVar27._4_4_ = uVar17;
  auVar27._0_4_ = uVar17;
  auVar27._8_4_ = uVar17;
  auVar27._12_4_ = uVar17;
  auVar27._16_4_ = uVar17;
  auVar27._20_4_ = uVar17;
  auVar27._24_4_ = uVar17;
  auVar27._28_4_ = uVar17;
  local_10e0 = vpcmpeqd_avx2(auVar27,local_10c0);
  uVar17 = vmovmskps_avx(local_10e0);
  local_1338 = CONCAT44((int)((ulong)lVar8 >> 0x20),uVar17);
  auVar15._4_4_ = fStack_ffc;
  auVar15._0_4_ = local_1000;
  auVar15._8_4_ = fStack_ff8;
  auVar15._12_4_ = fStack_ff4;
  auVar15._16_4_ = fStack_ff0;
  auVar15._20_4_ = fStack_fec;
  auVar15._24_4_ = fStack_fe8;
  auVar15._28_4_ = uStack_fe4;
  auVar48._8_4_ = 0x7f800000;
  auVar48._0_8_ = 0x7f8000007f800000;
  auVar48._12_4_ = 0x7f800000;
  auVar48._16_4_ = 0x7f800000;
  auVar48._20_4_ = 0x7f800000;
  auVar48._24_4_ = 0x7f800000;
  auVar48._28_4_ = 0x7f800000;
  auVar50 = vblendvps_avx(auVar48,auVar15,local_10e0);
  local_1358 = ~local_1338 & local_1358;
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar7 = vminps_avx(auVar50,auVar7);
  auVar14._4_4_ = fStack_101c;
  auVar14._0_4_ = local_1020;
  auVar14._8_4_ = fStack_1018;
  auVar14._12_4_ = fStack_1014;
  auVar14._16_4_ = fStack_1010;
  auVar14._20_4_ = fStack_100c;
  auVar14._24_4_ = fStack_1008;
  auVar14._28_4_ = uStack_1004;
  auVar50 = vblendvps_avx(auVar48,auVar14,local_10e0);
  auVar9 = vminps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar10 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar13._4_4_ = fStack_103c;
  auVar13._0_4_ = local_1040;
  auVar13._8_4_ = fStack_1038;
  auVar13._12_4_ = fStack_1034;
  auVar13._16_4_ = fStack_1030;
  auVar13._20_4_ = fStack_102c;
  auVar13._24_4_ = fStack_1028;
  auVar13._28_4_ = uStack_1024;
  auVar50 = vblendvps_avx(auVar48,auVar13,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar9 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar11 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar50 = vblendvps_avx(auVar49,auVar15,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar9 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar50 = vblendvps_avx(auVar49,auVar14,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar10 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar50 = vblendvps_avx(auVar49,auVar13,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar9 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar50 = vblendvps_avx(auVar48,auVar52._0_32_,local_10e0);
  auVar5 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar7 = vminps_avx(auVar50,auVar7);
  auVar50 = vblendvps_avx(auVar48,auVar53._0_32_,local_10e0);
  auVar9 = vminps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar10 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar50 = vblendvps_avx(auVar48,auVar54._0_32_,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar9 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar36 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar50 = vblendvps_avx(auVar49,auVar52._0_32_,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar9 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar50 = vblendvps_avx(auVar49,auVar53._0_32_,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar10 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar50 = vblendvps_avx(auVar49,auVar54._0_32_,local_10e0);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar50 = vmaxps_avx(auVar50,auVar7);
  auVar9 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar50 = vblendvps_avx(auVar48,local_11c0,local_10e0);
  auVar41 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar7 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar50 = vminps_avx(auVar50,auVar7);
  auVar7 = vshufpd_avx(auVar50,auVar50,5);
  auVar7 = vminps_avx(auVar50,auVar7);
  local_1300 = vblendvps_avx(auVar49,local_1060,local_10e0);
  auVar50 = vshufps_avx(local_1300,local_1300,0xb1);
  auVar50 = vmaxps_avx(local_1300,auVar50);
  auVar3 = vshufpd_avx(auVar50,auVar50,5);
  auVar4 = vcmpps_avx(auVar36,_DAT_01f45a50,5);
  auVar9 = vblendvps_avx(auVar41,auVar36,auVar4);
  auVar10 = vblendvps_avx(auVar11,auVar5,auVar4);
  auVar50 = vmaxps_avx(auVar50,auVar3);
  auVar11 = vblendvps_avx(auVar5,auVar11,auVar4);
  local_11d0 = auVar9._0_4_;
  auVar5 = vmovshdup_avx(auVar9);
  local_1328 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x20;
  auVar5 = vshufpd_avx(auVar9,auVar9,1);
  uVar26 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x40;
  local_1330 = local_1328 ^ 0x10;
  auVar6 = vminps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar5 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
  auVar7._4_4_ = fStack_113c;
  auVar7._0_4_ = local_1140;
  auVar7._8_4_ = fStack_1138;
  auVar7._12_4_ = fStack_1134;
  auVar7._16_4_ = fStack_1130;
  auVar7._20_4_ = fStack_112c;
  auVar7._24_4_ = fStack_1128;
  auVar7._28_4_ = uStack_1124;
  auVar3._4_4_ = fStack_111c;
  auVar3._0_4_ = local_1120;
  auVar3._8_4_ = fStack_1118;
  auVar3._12_4_ = fStack_1114;
  auVar3._16_4_ = fStack_1110;
  auVar3._20_4_ = fStack_110c;
  auVar3._24_4_ = fStack_1108;
  auVar3._28_4_ = uStack_1104;
  auVar4 = vblendvps_avx(auVar36,auVar41,auVar4);
  auVar41._0_4_ = auVar10._0_4_ * local_11d0;
  auVar41._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar41._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar41._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar50._4_4_ = fStack_10fc;
  auVar50._0_4_ = local_1100;
  auVar50._8_4_ = fStack_10f8;
  auVar50._12_4_ = fStack_10f4;
  auVar50._16_4_ = fStack_10f0;
  auVar50._20_4_ = fStack_10ec;
  auVar50._24_4_ = fStack_10e8;
  auVar50._28_4_ = uStack_10e4;
  local_1230 = auVar4._0_4_;
  auVar36._0_4_ = auVar11._0_4_ * local_1230;
  auVar36._4_4_ = auVar11._4_4_ * auVar4._4_4_;
  auVar36._8_4_ = auVar11._8_4_ * auVar4._8_4_;
  auVar36._12_4_ = auVar11._12_4_ * auVar4._12_4_;
  uVar19 = (ulong)(local_11d0 < 0.0) * 0x10;
  local_fa0[0] = *(ulong *)&local_1360[1].bounds.bounds0.lower.field_0;
  local_fa0[1] = local_1338;
  local_11e0 = (uint)auVar41._0_4_ ^ local_12b0;
  uStack_11dc = (uint)auVar41._0_4_ ^ uStack_12ac;
  uStack_11d8 = (uint)auVar41._0_4_ ^ uStack_12a8;
  uStack_11d4 = (uint)auVar41._0_4_ ^ uStack_12a4;
  local_11f0 = vshufps_avx(auVar9,auVar9,0x55);
  auVar10 = vshufps_avx(auVar41,auVar41,0x55);
  local_1200._0_4_ = auVar10._0_4_ ^ local_12b0;
  local_1200._4_4_ = auVar10._4_4_ ^ uStack_12ac;
  local_1200._8_4_ = auVar10._8_4_ ^ uStack_12a8;
  local_1200._12_4_ = auVar10._12_4_ ^ uStack_12a4;
  local_1210 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar9 = vshufps_avx(auVar41,auVar41,0xaa);
  local_1220 = auVar9._0_4_ ^ local_12b0;
  uStack_121c = auVar9._4_4_ ^ uStack_12ac;
  uStack_1218 = auVar9._8_4_ ^ uStack_12a8;
  uStack_1214 = auVar9._12_4_ ^ uStack_12a4;
  local_1240 = (uint)auVar36._0_4_ ^ local_12b0;
  uStack_123c = (uint)auVar36._0_4_ ^ uStack_12ac;
  uStack_1238 = (uint)auVar36._0_4_ ^ uStack_12a8;
  uStack_1234 = (uint)auVar36._0_4_ ^ uStack_12a4;
  local_1250 = vshufps_avx(auVar4,auVar4,0x55);
  auVar9 = vshufps_avx(auVar36,auVar36,0x55);
  local_1260._0_4_ = auVar9._0_4_ ^ local_12b0;
  local_1260._4_4_ = auVar9._4_4_ ^ uStack_12ac;
  local_1260._8_4_ = auVar9._8_4_ ^ uStack_12a8;
  local_1260._12_4_ = auVar9._12_4_ ^ uStack_12a4;
  local_1270 = vshufps_avx(auVar4,auVar4,0xaa);
  auVar9 = vshufps_avx(auVar36,auVar36,0xaa);
  local_1280._0_4_ = auVar9._0_4_ ^ local_12b0;
  local_1280._4_4_ = auVar9._4_4_ ^ uStack_12ac;
  local_1280._8_4_ = auVar9._8_4_ ^ uStack_12a8;
  local_1280._12_4_ = auVar9._12_4_ ^ uStack_12a4;
  local_1290 = auVar6._0_4_;
  local_12a0 = auVar5._0_4_;
  puVar25 = local_fa0 + 2;
  auVar44._4_4_ = uStack_107c;
  auVar44._0_4_ = local_1080;
  auVar44._8_4_ = uStack_1078;
  auVar44._12_4_ = uStack_1074;
  auVar44._16_4_ = uStack_1070;
  auVar44._20_4_ = uStack_106c;
  auVar44._24_4_ = uStack_1068;
  auVar44._28_4_ = uStack_1064;
  auVar31 = vblendvps_avx(auVar44,local_11c0,local_10e0);
  local_fe0 = auVar31;
  auVar55 = ZEXT3264(auVar55._0_32_);
  uStack_129c = local_12a0;
  uStack_1298 = local_12a0;
  uStack_1294 = local_12a0;
  uStack_128c = local_1290;
  uStack_1288 = local_1290;
  uStack_1284 = local_1290;
  fStack_122c = local_1230;
  fStack_1228 = local_1230;
  fStack_1224 = local_1230;
  fStack_11cc = local_11d0;
  fStack_11c8 = local_11d0;
  fStack_11c4 = local_11d0;
LAB_0161e8db:
  auVar32 = ZEXT3264(auVar31);
  local_1320 = auVar55._0_32_;
  uVar17 = vmovmskps_avx(local_1320);
  puVar24 = puVar25;
  do {
    auVar31 = auVar32._0_32_;
    if (puVar24 == local_fa0) goto LAB_0161ec35;
    puVar25 = puVar24 + -2;
    puVar1 = puVar24 + -1;
    puVar24 = puVar25;
    if ((*puVar1 & ~CONCAT44((int)(local_1338 >> 0x20),uVar17)) != 0) {
      uVar22 = 1;
      uVar23 = *puVar25;
      do {
        puVar24 = puVar25;
        if ((uVar23 & 8) != 0) {
          if (uVar22 != 0) {
            local_1340 = (Primitive *)(uVar23 & 0xfffffffffffffff0);
            aVar29._0_4_ = auVar55._0_4_ ^ auVar51._0_4_;
            aVar29._4_4_ = auVar55._4_4_ ^ auVar51._4_4_;
            aVar29._8_4_ = auVar55._8_4_ ^ auVar51._8_4_;
            aVar29._12_4_ = auVar55._12_4_ ^ auVar51._12_4_;
            aVar29._16_4_ = auVar55._16_4_ ^ auVar51._16_4_;
            aVar29._20_4_ = auVar55._20_4_ ^ auVar51._20_4_;
            aVar29._24_4_ = auVar55._24_4_ ^ auVar51._24_4_;
            aVar29._28_4_ = auVar55._28_4_ ^ auVar51._28_4_;
            local_1338 = (ulong)((uint)uVar23 & 0xf) - 7;
            goto LAB_0161eb0c;
          }
          break;
        }
        auVar9._4_4_ = uStack_11dc;
        auVar9._0_4_ = local_11e0;
        auVar9._8_4_ = uStack_11d8;
        auVar9._12_4_ = uStack_11d4;
        auVar12._4_4_ = fStack_11cc;
        auVar12._0_4_ = local_11d0;
        auVar12._8_4_ = fStack_11c8;
        auVar12._12_4_ = fStack_11c4;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar19),auVar9,auVar12);
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + local_1328),local_1200,
                                  local_11f0);
        auVar9 = vpmaxsd_avx(auVar9,auVar10);
        auVar6._4_4_ = uStack_121c;
        auVar6._0_4_ = local_1220;
        auVar6._8_4_ = uStack_1218;
        auVar6._12_4_ = uStack_1214;
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar26),auVar6,local_1210);
        auVar11._4_4_ = uStack_128c;
        auVar11._0_4_ = local_1290;
        auVar11._8_4_ = uStack_1288;
        auVar11._12_4_ = uStack_1284;
        auVar10 = vpmaxsd_avx(auVar10,auVar11);
        auVar9 = vpmaxsd_avx(auVar9,auVar10);
        auVar10._4_4_ = uStack_123c;
        auVar10._0_4_ = local_1240;
        auVar10._8_4_ = uStack_1238;
        auVar10._12_4_ = uStack_1234;
        auVar5._4_4_ = fStack_122c;
        auVar5._0_4_ = local_1230;
        auVar5._8_4_ = fStack_1228;
        auVar5._12_4_ = fStack_1224;
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar19 ^ 0x10)),auVar10,
                                  auVar5);
        auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + local_1330),local_1260,
                                  local_1250);
        auVar10 = vpminsd_avx(auVar10,auVar11);
        auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar26 ^ 0x10)),local_1280
                                  ,local_1270);
        auVar4._4_4_ = uStack_129c;
        auVar4._0_4_ = local_12a0;
        auVar4._8_4_ = uStack_1298;
        auVar4._12_4_ = uStack_1294;
        auVar11 = vpminsd_avx(auVar11,auVar4);
        auVar10 = vpminsd_avx(auVar10,auVar11);
        auVar9 = vcmpps_avx(auVar9,auVar10,2);
        auVar32 = ZEXT1664(auVar9);
        uVar16 = vmovmskps_avx(auVar9);
        if (uVar16 == 0) break;
        uVar18 = (ulong)(uVar16 & 0xff);
        uVar22 = 0;
        uVar20 = 8;
        do {
          lVar8 = 0;
          for (uVar21 = uVar18; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar2 = *(undefined4 *)(uVar23 + 0x20 + lVar8 * 4);
          auVar28._4_4_ = uVar2;
          auVar28._0_4_ = uVar2;
          auVar28._8_4_ = uVar2;
          auVar28._12_4_ = uVar2;
          auVar28._16_4_ = uVar2;
          auVar28._20_4_ = uVar2;
          auVar28._24_4_ = uVar2;
          auVar28._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar23 + 0x40 + lVar8 * 4);
          auVar34._4_4_ = uVar2;
          auVar34._0_4_ = uVar2;
          auVar34._8_4_ = uVar2;
          auVar34._12_4_ = uVar2;
          auVar34._16_4_ = uVar2;
          auVar34._20_4_ = uVar2;
          auVar34._24_4_ = uVar2;
          auVar34._28_4_ = uVar2;
          auVar9 = vfmadd213ps_fma(auVar28,auVar52._0_32_,auVar50);
          auVar10 = vfmadd213ps_fma(auVar34,auVar53._0_32_,auVar3);
          uVar2 = *(undefined4 *)(uVar23 + 0x60 + lVar8 * 4);
          auVar39._4_4_ = uVar2;
          auVar39._0_4_ = uVar2;
          auVar39._8_4_ = uVar2;
          auVar39._12_4_ = uVar2;
          auVar39._16_4_ = uVar2;
          auVar39._20_4_ = uVar2;
          auVar39._24_4_ = uVar2;
          auVar39._28_4_ = uVar2;
          auVar11 = vfmadd213ps_fma(auVar39,auVar54._0_32_,auVar7);
          uVar2 = *(undefined4 *)(uVar23 + 0x30 + lVar8 * 4);
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          auVar40._16_4_ = uVar2;
          auVar40._20_4_ = uVar2;
          auVar40._24_4_ = uVar2;
          auVar40._28_4_ = uVar2;
          auVar4 = vfmadd213ps_fma(auVar40,auVar52._0_32_,auVar50);
          uVar2 = *(undefined4 *)(uVar23 + 0x50 + lVar8 * 4);
          auVar45._4_4_ = uVar2;
          auVar45._0_4_ = uVar2;
          auVar45._8_4_ = uVar2;
          auVar45._12_4_ = uVar2;
          auVar45._16_4_ = uVar2;
          auVar45._20_4_ = uVar2;
          auVar45._24_4_ = uVar2;
          auVar45._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar23 + 0x70 + lVar8 * 4);
          auVar47._4_4_ = uVar2;
          auVar47._0_4_ = uVar2;
          auVar47._8_4_ = uVar2;
          auVar47._12_4_ = uVar2;
          auVar47._16_4_ = uVar2;
          auVar47._20_4_ = uVar2;
          auVar47._24_4_ = uVar2;
          auVar47._28_4_ = uVar2;
          auVar5 = vfmadd213ps_fma(auVar45,auVar53._0_32_,auVar3);
          auVar36 = vfmadd213ps_fma(auVar47,auVar54._0_32_,auVar7);
          auVar31 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar4));
          auVar38 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar5));
          auVar31 = vpmaxsd_avx2(auVar31,auVar38);
          auVar38 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar36));
          auVar38 = vpmaxsd_avx2(auVar38,local_fe0);
          auVar31 = vpmaxsd_avx2(auVar31,auVar38);
          auVar38 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar4));
          auVar33 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar5));
          auVar33 = vpminsd_avx2(auVar38,auVar33);
          auVar38 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar36));
          auVar38 = vpminsd_avx2(auVar38,local_1300);
          auVar38 = vpminsd_avx2(auVar33,auVar38);
          auVar31 = vcmpps_avx(auVar31,auVar38,2);
          auVar32 = ZEXT3264(auVar31);
          uVar21 = uVar20;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            uVar21 = *(ulong *)(uVar23 + lVar8 * 8);
            if (uVar20 != 8) {
              *puVar25 = uVar20;
              puVar25[1] = uVar22;
              puVar25 = puVar25 + 2;
            }
            uVar16 = vmovmskps_avx(auVar31);
            uVar22 = (ulong)uVar16;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar20 = uVar21;
        } while (uVar18 != 0);
        uVar23 = uVar21;
        puVar24 = puVar25;
      } while (uVar21 != 8);
    }
  } while( true );
  while( true ) {
    auVar51 = ZEXT1664(auVar51._0_16_);
    prim = local_1340;
    local_1340 = local_1340 + 1;
    local_12e0 = aVar29;
    InstanceIntersectorK<8>::occluded
              ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)&local_12e0.field_1,&local_1369,ray,
               local_1348,prim);
    auVar50 = auVar51._0_32_;
    aVar29.v = (__m256)vandnps_avx(local_fc0.v,local_12e0.v);
    auVar7 = (undefined1  [32])local_12e0 & ~(undefined1  [32])local_fc0;
    ray = local_1350;
    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar7 >> 0x7f,0) == '\0') &&
          (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar7 >> 0xbf,0) == '\0') &&
        (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar7[0x1f])
    break;
LAB_0161eb0c:
    auVar50 = auVar51._0_32_;
    local_1338 = local_1338 - 1;
    if (local_1338 == 0) break;
  }
  auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
  auVar51 = ZEXT3264(auVar50);
  auVar30._0_4_ = auVar50._0_4_ ^ aVar29.i[0];
  auVar30._4_4_ = auVar50._4_4_ ^ aVar29.i[1];
  auVar30._8_4_ = auVar50._8_4_ ^ aVar29.i[2];
  auVar30._12_4_ = auVar50._12_4_ ^ aVar29.i[3];
  auVar30._16_4_ = auVar50._16_4_ ^ aVar29.i[4];
  auVar30._20_4_ = auVar50._20_4_ ^ aVar29.i[5];
  auVar30._24_4_ = auVar50._24_4_ ^ aVar29.i[6];
  auVar30._28_4_ = auVar50._28_4_ ^ aVar29.i[7];
  auVar50 = vorps_avx(local_1320,auVar30);
  auVar55 = ZEXT3264(auVar50);
  auVar7 = local_10e0 & ~auVar50;
  if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar7 >> 0x7f,0) == '\0') &&
        (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar7 >> 0xbf,0) == '\0') &&
      (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar7[0x1f])
  goto LAB_0161ec0e;
  local_10e0 = vandnps_avx(auVar50,local_10e0);
  auVar31._8_4_ = 0xff800000;
  auVar31._0_8_ = 0xff800000ff800000;
  auVar31._12_4_ = 0xff800000;
  auVar31._16_4_ = 0xff800000;
  auVar31._20_4_ = 0xff800000;
  auVar31._24_4_ = 0xff800000;
  auVar31._28_4_ = 0xff800000;
  local_1300 = vblendvps_avx(local_1300,auVar31,auVar50);
  auVar52 = ZEXT3264(local_1160);
  auVar53 = ZEXT3264(local_1180);
  auVar54 = ZEXT3264(local_11a0);
  auVar50._4_4_ = fStack_10fc;
  auVar50._0_4_ = local_1100;
  auVar50._8_4_ = fStack_10f8;
  auVar50._12_4_ = fStack_10f4;
  auVar50._16_4_ = fStack_10f0;
  auVar50._20_4_ = fStack_10ec;
  auVar50._24_4_ = fStack_10e8;
  auVar50._28_4_ = uStack_10e4;
  auVar3._4_4_ = fStack_111c;
  auVar3._0_4_ = local_1120;
  auVar3._8_4_ = fStack_1118;
  auVar3._12_4_ = fStack_1114;
  auVar3._16_4_ = fStack_1110;
  auVar3._20_4_ = fStack_110c;
  auVar3._24_4_ = fStack_1108;
  auVar3._28_4_ = uStack_1104;
  auVar7._4_4_ = fStack_113c;
  auVar7._0_4_ = local_1140;
  auVar7._8_4_ = fStack_1138;
  auVar7._12_4_ = fStack_1134;
  auVar7._16_4_ = fStack_1130;
  auVar7._20_4_ = fStack_112c;
  auVar7._24_4_ = fStack_1128;
  auVar7._28_4_ = uStack_1124;
  goto LAB_0161e8db;
LAB_0161ec0e:
  auVar52 = ZEXT3264(local_1160);
  auVar53 = ZEXT3264(local_1180);
  auVar54 = ZEXT3264(local_11a0);
  auVar31 = local_10e0;
LAB_0161ec35:
  if (local_1358 == 0) {
    auVar50 = vpcmpeqd_avx2(auVar31,auVar31);
    auVar50 = vpcmpeqd_avx2(auVar50,(undefined1  [32])local_10a0);
    auVar50 = vpand_avx2(auVar55._0_32_,auVar50);
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar35._16_4_ = 0xff800000;
    auVar35._20_4_ = 0xff800000;
    auVar35._24_4_ = 0xff800000;
    auVar35._28_4_ = 0xff800000;
    auVar50 = vmaskmovps_avx(auVar50,auVar35);
    *(undefined1 (*) [32])local_1368 = auVar50;
    return;
  }
  goto LAB_0161e495;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }